

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O1

BtorSimBitVector * btorsim_bv_sdiv(BtorSimBitVector *a,BtorSimBitVector *b)

{
  BtorSimBitVector *pBVar1;
  BtorSimBitVector *bv;
  BtorSimBitVector *pBVar2;
  BtorSimBitVector *a_00;
  BtorSimBitVector *b_00;
  BtorSimBitVector *__ptr;
  BtorSimBitVector *__ptr_00;
  BtorSimBitVector *__ptr_01;
  BtorSimBitVector *a_01;
  BtorSimBitVector *b_01;
  uint32_t uVar3;
  BtorSimBitVector *pBVar4;
  BtorSimBitVector *res;
  BtorSimBitVector *local_38;
  
  if (a->width == 1) {
    pBVar1 = btorsim_bv_not(a);
    bv = btorsim_bv_and(pBVar1,b);
    pBVar2 = btorsim_bv_not(bv);
  }
  else {
    uVar3 = a->width - 1;
    a_00 = btorsim_bv_slice(a,uVar3,uVar3);
    uVar3 = b->width - 1;
    b_00 = btorsim_bv_slice(b,uVar3,uVar3);
    __ptr = btorsim_bv_xor(a_00,b_00);
    __ptr_00 = btorsim_bv_neg(a);
    __ptr_01 = btorsim_bv_neg(b);
    if ((a_00->width != 1) || (pBVar1 = __ptr_00, ((&a_00[1].width)[a_00->len - 1] & 1) == 0)) {
      pBVar1 = a;
    }
    a_01 = btorsim_bv_new(pBVar1->width);
    memcpy(a_01 + 1,pBVar1 + 1,(ulong)pBVar1->len << 2);
    if ((b_00->width != 1) || (pBVar1 = __ptr_01, ((&b_00[1].width)[b_00->len - 1] & 1) == 0)) {
      pBVar1 = b;
    }
    b_01 = btorsim_bv_new(pBVar1->width);
    memcpy(b_01 + 1,pBVar1 + 1,(ulong)pBVar1->len << 2);
    local_38 = (BtorSimBitVector *)0x0;
    udiv_urem_bv(a_01,b_01,&local_38,(BtorSimBitVector **)0x0);
    pBVar1 = local_38;
    bv = btorsim_bv_neg(local_38);
    if ((__ptr->width != 1) || (pBVar4 = bv, ((&__ptr[1].width)[__ptr->len - 1] & 1) == 0)) {
      pBVar4 = pBVar1;
    }
    pBVar2 = btorsim_bv_new(pBVar4->width);
    memcpy(pBVar2 + 1,pBVar4 + 1,(ulong)pBVar4->len << 2);
    free(a_00);
    free(b_00);
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
    free(a_01);
    free(b_01);
  }
  free(pBVar1);
  free(bv);
  return pBVar2;
}

Assistant:

BtorSimBitVector *
btorsim_bv_sdiv (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  BtorSimBitVector *res = 0, *not_a, *not_a_and_b, *sign_a, *sign_b, *xor;
  BtorSimBitVector *neg_a, *neg_b, *cond_a, *cond_b, *udiv, *neg_udiv;

  if (a->width == 1)
  {
    not_a       = btorsim_bv_not (a);
    not_a_and_b = btorsim_bv_and (not_a, b);
    res         = btorsim_bv_not (not_a_and_b);
    btorsim_bv_free (not_a);
    btorsim_bv_free (not_a_and_b);
  }
  else
  {
    sign_a   = btorsim_bv_slice (a, a->width - 1, a->width - 1);
    sign_b   = btorsim_bv_slice (b, b->width - 1, b->width - 1);
    xor      = btorsim_bv_xor (sign_a, sign_b);
    neg_a    = btorsim_bv_neg (a);
    neg_b    = btorsim_bv_neg (b);
    cond_a   = btorsim_bv_is_true (sign_a) ? btorsim_bv_copy (neg_a)
                                           : btorsim_bv_copy (a);
    cond_b   = btorsim_bv_is_true (sign_b) ? btorsim_bv_copy (neg_b)
                                           : btorsim_bv_copy (b);
    udiv     = btorsim_bv_udiv (cond_a, cond_b);
    neg_udiv = btorsim_bv_neg (udiv);
    res      = btorsim_bv_is_true (xor) ? btorsim_bv_copy (neg_udiv)
                                        : btorsim_bv_copy (udiv);
    btorsim_bv_free (sign_a);
    btorsim_bv_free (sign_b);
    btorsim_bv_free (xor);
    btorsim_bv_free (neg_a);
    btorsim_bv_free (neg_b);
    btorsim_bv_free (cond_a);
    btorsim_bv_free (cond_b);
    btorsim_bv_free (udiv);
    btorsim_bv_free (neg_udiv);
  }

  assert (res);
  assert (rem_bits_zero_dbg (res));

  return res;
}